

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

int notify_single_fd_multiple_events(int epfd,epoll_event *events,int maxevents,int timeout)

{
  int iVar1;
  
  iVar1 = -1;
  if (epoll_wait_fake.call_count == 1) {
    events->events = 5;
    (events->data).ptr = event_list[0];
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int notify_single_fd_multiple_events(int epfd, struct epoll_event *events,
                                            int maxevents, int timeout)
{
	(void)epfd;
	(void)maxevents;
	(void)timeout;

	if (epoll_wait_fake.call_count == 1) {
		events[0].events = EPOLLIN | EPOLLOUT;
		events[0].data.ptr = event_list[0];
		return 1;
	} else {
		return -1;
	}
}